

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::TrigFunc::innerExtrema
          (Interval *__return_storage_ptr__,TrigFunc *this,EvalContext *param_1,Interval *angle)

{
  undefined7 uVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int hiSlope;
  int loSlope;
  double hi;
  double lo;
  Interval *angle_local;
  EvalContext *param_1_local;
  TrigFunc *this_local;
  
  dVar4 = tcu::Interval::lo(angle);
  dVar5 = tcu::Interval::hi(angle);
  iVar2 = (*(this->super_CFloatFunc1).super_FloatFunc1.
            super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .super_FuncBase._vptr_FuncBase[0x10])(dVar4);
  iVar3 = (*(this->super_CFloatFunc1).super_FloatFunc1.
            super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .super_FuncBase._vptr_FuncBase[0x10])(dVar5);
  dVar6 = tcu::Interval::length(angle);
  if (dVar6 < 6.283185307179586) {
    if ((iVar2 == 1) && (iVar3 == -1)) {
      uVar1 = *(undefined7 *)&(this->m_hiExtremum).field_0x1;
      __return_storage_ptr__->m_hasNaN = (this->m_hiExtremum).m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->field_0x1 = uVar1;
      __return_storage_ptr__->m_lo = (this->m_hiExtremum).m_lo;
      __return_storage_ptr__->m_hi = (this->m_hiExtremum).m_hi;
    }
    else if ((iVar2 == -1) && (iVar3 == 1)) {
      uVar1 = *(undefined7 *)&(this->m_loExtremum).field_0x1;
      __return_storage_ptr__->m_hasNaN = (this->m_loExtremum).m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->field_0x1 = uVar1;
      __return_storage_ptr__->m_lo = (this->m_loExtremum).m_lo;
      __return_storage_ptr__->m_hi = (this->m_loExtremum).m_hi;
    }
    else {
      if (iVar2 == iVar3) {
        (*(this->super_CFloatFunc1).super_FloatFunc1.
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xd])(dVar5);
        (*(this->super_CFloatFunc1).super_FloatFunc1.
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xd])(dVar4);
        iVar3 = deIntSign(extraout_XMM0_Qa - extraout_XMM0_Qa_00);
        if (iVar3 * iVar2 == -1) {
          tcu::Interval::operator|(__return_storage_ptr__,&this->m_hiExtremum,&this->m_loExtremum);
          return __return_storage_ptr__;
        }
      }
      tcu::Interval::Interval(__return_storage_ptr__);
    }
  }
  else {
    tcu::Interval::operator|(__return_storage_ptr__,&this->m_hiExtremum,&this->m_loExtremum);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval		innerExtrema	(const EvalContext&, const Interval& angle) const
	{
		const double		lo		= angle.lo();
		const double		hi		= angle.hi();
		const int			loSlope	= doGetSlope(lo);
		const int			hiSlope	= doGetSlope(hi);

		// Detect the high and low values the function can take between the
		// interval endpoints.
		if (angle.length() >= 2.0 * DE_PI_DOUBLE)
		{
			// The interval is longer than a full cycle, so it must get all possible values.
			return m_hiExtremum | m_loExtremum;
		}
		else if (loSlope == 1 && hiSlope == -1)
		{
			// The slope can change from positive to negative only at the maximum value.
			return m_hiExtremum;
		}
		else if (loSlope == -1 && hiSlope == 1)
		{
			// The slope can change from negative to positive only at the maximum value.
			return m_loExtremum;
		}
		else if (loSlope == hiSlope &&
				 deIntSign(applyExact(hi) - applyExact(lo)) * loSlope == -1)
		{
			// The slope has changed twice between the endpoints, so both extrema are included.
			return m_hiExtremum | m_loExtremum;
		}

		return Interval();
	}